

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

int Gia_ManArePerform(Gia_Man_t *pAig,int nStatesMax,int fMiter,int fVerbose)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *pGVar7;
  Gia_ManAre_t *p;
  Gia_StaAre_t *pSta;
  Abc_Cex_t *pAVar8;
  long lVar9;
  Gia_PtrAre_t Sta;
  uint uVar10;
  Gia_ManAre_t *pGVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  Gia_Man_t *pGVar15;
  double dVar16;
  timespec ts;
  timespec local_58;
  Gia_Man_t *local_48;
  double local_40;
  int local_34;
  
  iVar2 = clock_gettime(3,&local_58);
  if (iVar2 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  if (pAig->nRegs < 0x4001) {
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
      pAig->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pGVar7 = Gia_ManDup(pAig);
    p = Gia_ManAreCreate(pGVar7);
    p->fMiter = fMiter;
    pGVar7 = p->pAig;
    lVar9 = (long)pGVar7->nRegs;
    if (0 < lVar9) {
      pVVar1 = pGVar7->vCos;
      iVar2 = pVVar1->nSize;
      uVar10 = iVar2 - pGVar7->nRegs;
      do {
        if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = pVVar1->pArray[uVar10];
        if (((long)iVar6 < 0) || (pGVar7->nObjs <= iVar6)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar7->pObjs[iVar6].Value = 0;
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    pSta = Gia_ManAreCreateStaNew(p);
    Gia_ManAreCubeProcess(p,pSta);
    p->iStaCur = 1;
    local_34 = 1;
    if (1 < p->nStas) {
      Sta = (Gia_PtrAre_t)0x1;
      do {
        iVar2 = Gia_ManAreDeriveNexts(p,Sta);
        if ((iVar2 != 0) || (nStatesMax < p->nStas)) {
          pAVar8 = Gia_ManAreDeriveCex(p,p->pTarget);
          pAig->pCexSeq = pAVar8;
        }
        if (p->fStopped != 0) {
          local_34 = -1;
          goto LAB_0069f763;
        }
        if (fVerbose != 0) {
          Gia_ManArePrintReport(p,lVar14,0);
        }
        Sta = (Gia_PtrAre_t)(p->iStaCur + 1);
        p->iStaCur = (int)Sta;
      } while ((int)Sta < p->nStas);
      local_34 = 1;
    }
LAB_0069f763:
    local_48 = pAig;
    Gia_ManArePrintReport(p,lVar14,1);
    pcVar13 = "Stopped";
    if (p->fStopped == 0) {
      pcVar13 = "Completed";
    }
    uVar10 = p->nStas;
    uVar3 = Gia_ManAreListCountUsed_rec(p,p->Root,p->fTree);
    uVar4 = Gia_ManAreDepth(p,p->iStaCur + -1);
    iVar2 = 0x92b81b;
    printf("%s after finding %d state cubes (%d not contained) with depth %d.  ",pcVar13,
           (ulong)uVar10,(ulong)uVar3,(ulong)uVar4);
    Abc_Print(iVar2,"%s =","Time");
    iVar6 = 3;
    iVar2 = clock_gettime(3,&local_58);
    pGVar7 = local_48;
    if (iVar2 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar9 - lVar14) / 1000000.0);
    iVar2 = local_34;
    if (pGVar7->pCexSeq != (Abc_Cex_t *)0x0) {
      uVar10 = p->iStaCur;
      pcVar13 = local_48->pName;
      pGVar11 = p;
      iVar5 = Gia_ManAreDepth(p,uVar10);
      pGVar7 = local_48;
      iVar6 = (int)pGVar11;
      Abc_Print(iVar6,"Output %d of miter \"%s\" was asserted in frame %d.\n",(ulong)uVar10,pcVar13,
                (ulong)(iVar5 - 1));
    }
    if (fVerbose != 0) {
      Abc_Print(iVar6,"%s =","Cofactoring");
      local_48 = (Gia_Man_t *)(double)(p->timeAig - p->timeCube);
      iVar5 = 3;
      iVar6 = clock_gettime(3,&local_58);
      if (iVar6 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      dVar16 = 0.0;
      pGVar15 = (Gia_Man_t *)((double)local_48 / 1000000.0);
      if (lVar9 != lVar14) {
        local_40 = (double)(p->timeAig - p->timeCube) * 100.0;
        iVar5 = 3;
        local_48 = (Gia_Man_t *)((double)local_48 / 1000000.0);
        iVar6 = clock_gettime(3,&local_58);
        if (iVar6 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
        }
        dVar16 = local_40 / (double)(lVar9 - lVar14);
        pGVar15 = local_48;
      }
      Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",pGVar15,dVar16);
      Abc_Print(iVar5,"%s =","Containment");
      local_48 = (Gia_Man_t *)(double)p->timeCube;
      iVar5 = 3;
      iVar6 = clock_gettime(3,&local_58);
      if (iVar6 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      dVar16 = 0.0;
      pGVar15 = (Gia_Man_t *)((double)local_48 / 1000000.0);
      if (lVar9 != lVar14) {
        local_40 = (double)p->timeCube * 100.0;
        iVar5 = 3;
        local_48 = (Gia_Man_t *)((double)local_48 / 1000000.0);
        iVar6 = clock_gettime(3,&local_58);
        if (iVar6 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
        }
        dVar16 = local_40 / (double)(lVar9 - lVar14);
        pGVar15 = local_48;
      }
      Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",pGVar15,dVar16);
      Abc_Print(iVar5,"%s =","Other      ");
      iVar6 = clock_gettime(3,&local_58);
      lVar12 = -1;
      lVar9 = -1;
      if (-1 < iVar6) {
        lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      local_48 = (Gia_Man_t *)(double)(lVar9 - (p->timeAig + lVar14));
      iVar5 = 3;
      iVar6 = clock_gettime(3,&local_58);
      if (-1 < iVar6) {
        lVar12 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      dVar16 = 0.0;
      pGVar15 = (Gia_Man_t *)((double)local_48 / 1000000.0);
      if (lVar12 != lVar14) {
        local_48 = (Gia_Man_t *)((double)local_48 / 1000000.0);
        iVar6 = clock_gettime(3,&local_58);
        lVar12 = -1;
        lVar9 = -1;
        if (-1 < iVar6) {
          lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
        }
        local_40 = (double)(lVar9 - (p->timeAig + lVar14)) * 100.0;
        iVar5 = 3;
        iVar6 = clock_gettime(3,&local_58);
        if (-1 < iVar6) {
          lVar12 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
        }
        dVar16 = local_40 / (double)(lVar12 - lVar14);
        pGVar15 = local_48;
      }
      Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",pGVar15,dVar16);
      Abc_Print(iVar5,"%s =","TOTAL      ");
      iVar6 = clock_gettime(3,&local_58);
      lVar12 = -1;
      lVar9 = -1;
      if (-1 < iVar6) {
        lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      local_48 = (Gia_Man_t *)(double)(lVar9 - lVar14);
      iVar5 = 3;
      iVar6 = clock_gettime(3,&local_58);
      if (-1 < iVar6) {
        lVar12 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      dVar16 = 0.0;
      pGVar15 = (Gia_Man_t *)((double)local_48 / 1000000.0);
      if (lVar12 != lVar14) {
        local_48 = (Gia_Man_t *)((double)local_48 / 1000000.0);
        iVar6 = clock_gettime(3,&local_58);
        lVar12 = -1;
        lVar9 = -1;
        if (-1 < iVar6) {
          lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
        }
        local_40 = (double)(lVar9 - lVar14) * 100.0;
        iVar5 = 3;
        iVar6 = clock_gettime(3,&local_58);
        if (-1 < iVar6) {
          lVar12 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
        }
        dVar16 = local_40 / (double)(lVar12 - lVar14);
        pGVar15 = local_48;
      }
      Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",pGVar15,dVar16);
    }
    if (pGVar7->nRegs < 0x1f) {
      iVar6 = clock_gettime(3,&local_58);
      if (iVar6 < 0) {
        lVar14 = 1;
      }
      else {
        lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
        lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_58.tv_sec * -1000000;
      }
      uVar10 = Gia_ManCountMinterms(p);
      iVar6 = 0x92b87d;
      printf("The number of unique state minterms in computed state cubes is %d.   ",(ulong)uVar10);
      Abc_Print(iVar6,"%s =","Time");
      iVar5 = 3;
      iVar6 = clock_gettime(3,&local_58);
      if (iVar6 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar9 + lVar14) / 1000000.0);
    }
    Gia_ManAreFree(p);
    if (pGVar7->pCexSeq != (Abc_Cex_t *)0x0) {
      iVar2 = 0;
      iVar6 = Gia_ManVerifyCex(pGVar7,pGVar7->pCexSeq,0);
      if (iVar6 == 0) {
        pcVar13 = "Generated counter-example is INVALID.                       ";
      }
      else {
        pcVar13 = "Generated counter-example verified correctly.               ";
      }
      puts(pcVar13);
    }
  }
  else {
    printf("Currently can only handle circuit with up to %d registers.\n",0x4000);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Gia_ManArePerform( Gia_Man_t * pAig, int nStatesMax, int fMiter, int fVerbose )
{
//    extern Gia_Man_t * Gia_ManCompress2( Gia_Man_t * p, int fUpdateLevel, int fVerbose );
    extern Abc_Cex_t * Gia_ManAreDeriveCex( Gia_ManAre_t * p, Gia_StaAre_t * pLast );
    Gia_ManAre_t * p;
    abctime clk = Abc_Clock();
    int RetValue = 1;
    if ( Gia_ManRegNum(pAig) > MAX_VARS_NUM )
    {
        printf( "Currently can only handle circuit with up to %d registers.\n", MAX_VARS_NUM );
        return -1;
    }
    ABC_FREE( pAig->pCexSeq );
//    p = Gia_ManAreCreate( Gia_ManCompress2(pAig, 0, 0) );
    p = Gia_ManAreCreate( Gia_ManDup(pAig) );
    p->fMiter = fMiter;
    Gia_ManAreCubeProcess( p, Gia_ManAreCreateStaInit(p) );
    for ( p->iStaCur = 1; p->iStaCur < p->nStas; p->iStaCur++ )
    {
//        printf( "Explored state %d. Total cubes %d.\n", p->iStaCur, p->nStas-1 );
        if ( Gia_ManAreDeriveNexts( p, Gia_Int2Ptr(p->iStaCur) ) || p->nStas > nStatesMax )
            pAig->pCexSeq = Gia_ManAreDeriveCex( p, p->pTarget );
        if ( p->fStopped )
        {
            RetValue = -1;
            break;
        }
        if ( fVerbose )//&& p->iStaCur % 5000 == 0 )
            Gia_ManArePrintReport( p, clk, 0 );
    }
    Gia_ManArePrintReport( p, clk, 1 );
    printf( "%s after finding %d state cubes (%d not contained) with depth %d.  ", 
        p->fStopped ? "Stopped" : "Completed", 
        p->nStas, Gia_ManAreListCountUsed(p), 
        Gia_ManAreDepth(p, p->iStaCur-1) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    if ( pAig->pCexSeq != NULL )
        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.\n", 
            p->iStaCur, pAig->pName, Gia_ManAreDepth(p, p->iStaCur)-1 );
    if ( fVerbose )
    {
        ABC_PRTP( "Cofactoring", p->timeAig - p->timeCube,    Abc_Clock() - clk );
        ABC_PRTP( "Containment", p->timeCube,                 Abc_Clock() - clk );
        ABC_PRTP( "Other      ", Abc_Clock() - clk - p->timeAig,  Abc_Clock() - clk );
        ABC_PRTP( "TOTAL      ", Abc_Clock() - clk,               Abc_Clock() - clk );
    }
    if ( Gia_ManRegNum(pAig) <= 30 )
    {
        clk = Abc_Clock();
        printf( "The number of unique state minterms in computed state cubes is %d.   ", Gia_ManCountMinterms(p) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
//    printf( "Compares = %d.  Equals = %d.  Disj = %d.  Disj2 = %d.  Disj3 = %d.\n", 
//        p->nCompares, p->nEquals, p->nDisjs, p->nDisjs2, p->nDisjs3 );
//    Gia_ManAreFindBestVar( p, Gia_ManAreSta(p, p->Root) );
//    Gia_ManArePrintUsed( p );
    Gia_ManAreFree( p );
    // verify
    if ( pAig->pCexSeq )
    {
        if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            printf( "Generated counter-example is INVALID.                       \n" );
        else
            printf( "Generated counter-example verified correctly.               \n" );
        return 0;
    }
    return RetValue;
}